

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O3

ContentSpecNode * __thiscall
xercesc_4_0::ComplexTypeInfo::expandContentModel
          (ComplexTypeInfo *this,ContentSpecNode *specNode,int minOccurs,int maxOccurs,
          bool bAllowCompactSyntax)

{
  MemoryManager *pMVar1;
  NodeTypes NVar2;
  ContentSpecNode *pCVar3;
  ContentSpecNode *pCVar4;
  ContentSpecNode *pCVar5;
  int iVar6;
  
  if (specNode == (ContentSpecNode *)0x0) {
    specNode = (ContentSpecNode *)0x0;
  }
  else if ((minOccurs ^ 1U) != 0 || (maxOccurs ^ 1U) != 0) {
    pCVar4 = specNode;
    if ((maxOccurs ^ 1U) == 0 && minOccurs == 0) {
      pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
      NVar2 = ZeroOrOne;
    }
    else if (minOccurs == 0 && maxOccurs == -1) {
      pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
      NVar2 = ZeroOrMore;
    }
    else if ((minOccurs ^ 1U) == 0 && maxOccurs == -1) {
      pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
      NVar2 = OneOrMore;
    }
    else {
      if ((!bAllowCompactSyntax) ||
         ((specNode->fType != Leaf &&
          (2 < (uint)((specNode->fType & (Any_NS|Any_Other)) + ~Sequence))))) {
        if (maxOccurs == -1) {
          pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
          pMVar1 = this->fMemoryManager;
          (pCVar4->super_XSerializable)._vptr_XSerializable =
               (_func_int **)&PTR__ContentSpecNode_0040bea8;
          pCVar4->fMemoryManager = pMVar1;
          pCVar4->fElement = (QName *)0x0;
          pCVar4->fElementDecl = (XMLElementDecl *)0x0;
          pCVar4->fFirst = specNode;
          pCVar4->fSecond = (ContentSpecNode *)0x0;
          pCVar4->fType = OneOrMore;
          pCVar4->fAdoptFirst = true;
          pCVar4->fAdoptSecond = true;
          pCVar4->fMinOccurs = 1;
          pCVar4->fMaxOccurs = 1;
          if (minOccurs < 2) {
            return pCVar4;
          }
          iVar6 = minOccurs + -1;
          do {
            pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar3->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_0040bea8;
            pCVar3->fMemoryManager = pMVar1;
            pCVar3->fElement = (QName *)0x0;
            pCVar3->fElementDecl = (XMLElementDecl *)0x0;
            pCVar3->fFirst = specNode;
            pCVar3->fSecond = pCVar4;
            pCVar3->fType = Sequence;
            pCVar3->fAdoptFirst = false;
            pCVar3->fAdoptSecond = true;
            pCVar3->fMinOccurs = 1;
            pCVar3->fMaxOccurs = 1;
            iVar6 = iVar6 + -1;
            pCVar4 = pCVar3;
          } while (iVar6 != 0);
          return pCVar3;
        }
        if (minOccurs != 0) {
          if (1 < minOccurs) {
            pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar4->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_0040bea8;
            pCVar4->fMemoryManager = pMVar1;
            pCVar4->fElement = (QName *)0x0;
            pCVar4->fElementDecl = (XMLElementDecl *)0x0;
            pCVar4->fFirst = specNode;
            pCVar4->fSecond = specNode;
            pCVar4->fType = Sequence;
            pCVar4->fAdoptFirst = true;
            pCVar4->fAdoptSecond = false;
            pCVar4->fMinOccurs = 1;
            pCVar4->fMaxOccurs = 1;
            if (minOccurs != 2) {
              iVar6 = minOccurs + -2;
              pCVar3 = pCVar4;
              do {
                pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
                pMVar1 = this->fMemoryManager;
                (pCVar4->super_XSerializable)._vptr_XSerializable =
                     (_func_int **)&PTR__ContentSpecNode_0040bea8;
                pCVar4->fMemoryManager = pMVar1;
                pCVar4->fElement = (QName *)0x0;
                pCVar4->fElementDecl = (XMLElementDecl *)0x0;
                pCVar4->fFirst = pCVar3;
                pCVar4->fSecond = specNode;
                pCVar4->fType = Sequence;
                pCVar4->fAdoptFirst = true;
                pCVar4->fAdoptSecond = false;
                pCVar4->fMinOccurs = 1;
                pCVar4->fMaxOccurs = 1;
                iVar6 = iVar6 + -1;
                pCVar3 = pCVar4;
              } while (iVar6 != 0);
            }
          }
          if (maxOccurs <= minOccurs) {
            return pCVar4;
          }
          pCVar5 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
          pMVar1 = this->fMemoryManager;
          (pCVar5->super_XSerializable)._vptr_XSerializable =
               (_func_int **)&PTR__ContentSpecNode_0040bea8;
          pCVar5->fMemoryManager = pMVar1;
          pCVar5->fElement = (QName *)0x0;
          pCVar5->fElementDecl = (XMLElementDecl *)0x0;
          pCVar5->fFirst = specNode;
          pCVar5->fSecond = (ContentSpecNode *)0x0;
          pCVar5->fType = ZeroOrOne;
          pCVar5->fAdoptFirst = false;
          pCVar5->fAdoptSecond = true;
          pCVar5->fMinOccurs = 1;
          pCVar5->fMaxOccurs = 1;
          pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
          pMVar1 = this->fMemoryManager;
          (pCVar3->super_XSerializable)._vptr_XSerializable =
               (_func_int **)&PTR__ContentSpecNode_0040bea8;
          pCVar3->fMemoryManager = pMVar1;
          pCVar3->fElement = (QName *)0x0;
          pCVar3->fElementDecl = (XMLElementDecl *)0x0;
          pCVar3->fFirst = pCVar4;
          pCVar3->fSecond = pCVar5;
          pCVar3->fType = Sequence;
          pCVar3->fAdoptFirst = true;
          pCVar3->fAdoptSecond = true;
          pCVar3->fMinOccurs = 1;
          pCVar3->fMaxOccurs = 1;
          if (maxOccurs - minOccurs == 1) {
            return pCVar3;
          }
          iVar6 = ~minOccurs + maxOccurs;
          do {
            pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar4->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_0040bea8;
            pCVar4->fMemoryManager = pMVar1;
            pCVar4->fElement = (QName *)0x0;
            pCVar4->fElementDecl = (XMLElementDecl *)0x0;
            pCVar4->fFirst = pCVar3;
            pCVar4->fSecond = pCVar5;
            pCVar4->fType = Sequence;
            pCVar4->fAdoptFirst = true;
            pCVar4->fAdoptSecond = false;
            pCVar4->fMinOccurs = 1;
            pCVar4->fMaxOccurs = 1;
            iVar6 = iVar6 + -1;
            pCVar3 = pCVar4;
          } while (iVar6 != 0);
          return pCVar4;
        }
        pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
        pMVar1 = this->fMemoryManager;
        (pCVar4->super_XSerializable)._vptr_XSerializable =
             (_func_int **)&PTR__ContentSpecNode_0040bea8;
        pCVar4->fMemoryManager = pMVar1;
        pCVar4->fElement = (QName *)0x0;
        pCVar4->fElementDecl = (XMLElementDecl *)0x0;
        pCVar4->fFirst = specNode;
        pCVar4->fSecond = (ContentSpecNode *)0x0;
        pCVar4->fType = ZeroOrOne;
        pCVar4->fAdoptFirst = true;
        pCVar4->fAdoptSecond = true;
        pCVar4->fMinOccurs = 1;
        pCVar4->fMaxOccurs = 1;
        if (maxOccurs < 2) {
          return pCVar4;
        }
        iVar6 = maxOccurs + -1;
        pCVar3 = pCVar4;
        do {
          pCVar5 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
          pMVar1 = this->fMemoryManager;
          (pCVar5->super_XSerializable)._vptr_XSerializable =
               (_func_int **)&PTR__ContentSpecNode_0040bea8;
          pCVar5->fMemoryManager = pMVar1;
          pCVar5->fElement = (QName *)0x0;
          pCVar5->fElementDecl = (XMLElementDecl *)0x0;
          pCVar5->fFirst = pCVar3;
          pCVar5->fSecond = pCVar4;
          pCVar5->fType = Sequence;
          pCVar5->fAdoptFirst = true;
          pCVar5->fAdoptSecond = false;
          pCVar5->fMinOccurs = 1;
          pCVar5->fMaxOccurs = 1;
          iVar6 = iVar6 + -1;
          pCVar3 = pCVar5;
        } while (iVar6 != 0);
        return pCVar5;
      }
      pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
      pMVar1 = this->fMemoryManager;
      (pCVar4->super_XSerializable)._vptr_XSerializable =
           (_func_int **)&PTR__ContentSpecNode_0040bea8;
      pCVar4->fMemoryManager = pMVar1;
      pCVar4->fElement = (QName *)0x0;
      pCVar4->fElementDecl = (XMLElementDecl *)0x0;
      pCVar4->fFirst = specNode;
      pCVar4->fSecond = (ContentSpecNode *)0x0;
      pCVar4->fType = Loop;
      pCVar4->fAdoptFirst = true;
      pCVar4->fAdoptSecond = true;
      pCVar4->fMinOccurs = minOccurs;
      pCVar4->fMaxOccurs = maxOccurs;
      pMVar1 = this->fMemoryManager;
      if (minOccurs == 0) {
        pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,pMVar1);
        NVar2 = ZeroOrMore;
      }
      else {
        pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,pMVar1);
        NVar2 = OneOrMore;
      }
    }
    specNode = pCVar3;
    pMVar1 = this->fMemoryManager;
    (specNode->super_XSerializable)._vptr_XSerializable =
         (_func_int **)&PTR__ContentSpecNode_0040bea8;
    specNode->fMemoryManager = pMVar1;
    specNode->fElement = (QName *)0x0;
    specNode->fElementDecl = (XMLElementDecl *)0x0;
    specNode->fFirst = pCVar4;
    specNode->fSecond = (ContentSpecNode *)0x0;
    specNode->fType = NVar2;
    specNode->fAdoptFirst = true;
    specNode->fAdoptSecond = true;
    specNode->fMinOccurs = 1;
    specNode->fMaxOccurs = 1;
  }
  return specNode;
}

Assistant:

ContentSpecNode* ComplexTypeInfo::expandContentModel(ContentSpecNode* const specNode,
                                                     int minOccurs,
                                                     int maxOccurs,
                                                     bool bAllowCompactSyntax)
{
    if (!specNode) {
        return 0;
    }

    ContentSpecNode* const saveNode = specNode;
    ContentSpecNode* retNode = specNode;

    try
    {
        if (minOccurs == 1 && maxOccurs == 1) {
        }
        else if (minOccurs == 0 && maxOccurs == 1) {

            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::ZeroOrOne
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        else if (minOccurs == 0 && maxOccurs == -1) {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::ZeroOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        else if (minOccurs == 1 && maxOccurs == -1) {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::OneOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        // if what is being repeated is a leaf avoid expanding the tree
        else if(bAllowCompactSyntax &&
            (saveNode->getType()==ContentSpecNode::Leaf ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any_Other ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any_NS))
        {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::Loop
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
            retNode->setMinOccurs(minOccurs);
            retNode->setMaxOccurs(maxOccurs);

            if(minOccurs==0)
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::ZeroOrMore
                    , retNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );
            else
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::OneOrMore
                    , retNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );

        }
        else if (maxOccurs == -1) {

            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::OneOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );

            for (int i=0; i < (minOccurs-1); i++) {
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::Sequence
                    , saveNode
                    , retNode
                    , false
                    , true
                    , fMemoryManager
                );
            }
        }
        else {

            if (minOccurs == 0) {

                ContentSpecNode* optional = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::ZeroOrOne
                    , saveNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );

                retNode = optional;

                for (int i=0; i < (maxOccurs-1); i++) {
                    retNode = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , optional
                        , true
                        , false
                        , fMemoryManager
                    );
                }
            }
            else {

                if (minOccurs > 1) {

                    retNode = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , saveNode
                        , true
                        , false
                        , fMemoryManager
                    );

                    for (int i=1; i < (minOccurs-1); i++) {
                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , saveNode
                            , true
                            , false
                            , fMemoryManager
                        );
                    }
                }

                int counter = maxOccurs-minOccurs;

                if (counter > 0) {

                    ContentSpecNode* optional = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::ZeroOrOne
                        , saveNode
                        , 0
                        , false
                        , true
                        , fMemoryManager
                    );

                    try
                    {
                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , optional
                            , true
                            , true
                            , fMemoryManager
                        );
                    }
                    catch( const OutOfMemoryException& )
                    {
                        delete optional;
                        throw;
                    }

                    for (int j=1; j < counter; j++) {

                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , optional
                            , true
                            , false
                            , fMemoryManager
                        );
                    }
                }
            }
        }
    }
    catch( const OutOfMemoryException& )
    {
        delete retNode;
        throw;
    }

    return retNode;
}